

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O0

void __thiscall capnp::SchemaFile::DiskSchemaFile::~DiskSchemaFile(DiskSchemaFile *this)

{
  DiskSchemaFile *this_local;
  
  kj::String::~String(&this->displayName);
  kj::Own<const_kj::ReadableFile,_std::nullptr_t>::~Own(&this->file);
  kj::Path::~Path(&this->path);
  return;
}

Assistant:

class SchemaFile::DiskSchemaFile final: public SchemaFile {
public:
  DiskSchemaFile(const kj::ReadableDirectory& baseDir, kj::Path pathParam,
                 kj::ArrayPtr<const kj::ReadableDirectory* const> importPath,
                 kj::Own<const kj::ReadableFile> file,
                 kj::Maybe<kj::String> displayNameOverride)
      : baseDir(baseDir), path(kj::mv(pathParam)), importPath(importPath), file(kj::mv(file)) {
    KJ_IF_SOME(dn, displayNameOverride) {
      displayName = kj::mv(dn);
      displayNameOverridden = true;
    } else {
      displayName = path.toString();
      displayNameOverridden = false;
    }
  }

  kj::StringPtr getDisplayName() const override {
    return displayName;
  }